

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::StepFile::StepFileImporter::InternReadFile
          (StepFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t __n;
  _Alloc_hider _Var1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  shared_ptr<Assimp::IOStream> fileStream;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  shared_ptr<Assimp::IOStream> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  IOStream *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30 [2];
  
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(file->_M_dataplus)._M_p,mode_abi_cxx11_);
  local_60 = (IOStream *)CONCAT44(extraout_var,iVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_58,local_60);
  if (local_60 == (IOStream *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open file ",file);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_80._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_80._M_dataplus._M_p == psVar4) {
      local_80.field_2._M_allocated_capacity = *psVar4;
      local_80.field_2._8_8_ = plVar3[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar4;
    }
    local_80._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_80);
    *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
  local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  local_50._M_dataplus._M_p = (pointer)STEP::ReadFileHeader(&local_90);
  if (local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  __n = *(size_t *)(local_50._M_dataplus._M_p + 0x48);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_50._M_dataplus._M_p + 0x40);
  if ((__n != 0) && (__n == DAT_008f59e8)) {
    iVar2 = bcmp((__rhs->_M_dataplus)._M_p,StepFileSchema_abi_cxx11_,__n);
    if (iVar2 == 0) goto LAB_006770cc;
  }
  std::operator+(&local_80,"Unrecognized file schema: ",__rhs);
  std::runtime_error::runtime_error((runtime_error *)local_30,(string *)&local_80);
  local_30[0] = &PTR__runtime_error_0081d260;
  std::runtime_error::~runtime_error((runtime_error *)local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
LAB_006770cc:
  _Var1._M_p = local_50._M_dataplus._M_p;
  if ((DB *)local_50._M_dataplus._M_p != (DB *)0x0) {
    STEP::DB::~DB((DB *)local_50._M_dataplus._M_p);
    operator_delete(_Var1._M_p);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return;
}

Assistant:

void StepFileImporter::InternReadFile(const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    std::shared_ptr<IOStream> fileStream(pIOHandler->Open(file, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + file + ".");
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(fileStream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();
    if (!head.fileSchema.size() || head.fileSchema != StepFileSchema) {
        DeadlyImportError("Unrecognized file schema: " + head.fileSchema);
    }
}